

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O0

string * __thiscall
flatbuffers::kotlin::KotlinGenerator::ByteBufferGetter
          (string *__return_storage_ptr__,KotlinGenerator *this,Type *type,string *bb_var_name)

{
  BaseType *type_00;
  string local_128;
  allocator<char> local_101;
  string local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  Type local_60;
  allocator<char> local_3e;
  allocator<char> local_3d [20];
  allocator<char> local_29;
  string *local_28;
  string *bb_var_name_local;
  Type *type_local;
  KotlinGenerator *this_local;
  
  local_28 = bb_var_name;
  bb_var_name_local = (string *)type;
  type_local = (Type *)this;
  this_local = (KotlinGenerator *)__return_storage_ptr__;
  switch(type->base_type) {
  case BASE_TYPE_NONE:
  case BASE_TYPE_UTYPE:
  case BASE_TYPE_CHAR:
  case BASE_TYPE_UCHAR:
    std::operator+(__return_storage_ptr__,bb_var_name,".get");
    break;
  case BASE_TYPE_BOOL:
    std::operator+(&local_a0,"0.toByte() != ",bb_var_name);
    std::operator+(__return_storage_ptr__,&local_a0,".get");
    std::__cxx11::string::~string((string *)&local_a0);
    break;
  case BASE_TYPE_SHORT:
  case BASE_TYPE_USHORT:
    std::operator+(__return_storage_ptr__,bb_var_name,".getShort");
    break;
  case BASE_TYPE_INT:
  case BASE_TYPE_UINT:
    std::operator+(__return_storage_ptr__,bb_var_name,".getInt");
    break;
  case BASE_TYPE_LONG:
  case BASE_TYPE_ULONG:
    std::operator+(__return_storage_ptr__,bb_var_name,".getLong");
    break;
  case BASE_TYPE_FLOAT:
    std::operator+(__return_storage_ptr__,bb_var_name,".getFloat");
    break;
  case BASE_TYPE_DOUBLE:
    std::operator+(__return_storage_ptr__,bb_var_name,".getDouble");
    break;
  case BASE_TYPE_STRING:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"__string",&local_29);
    std::allocator<char>::~allocator(&local_29);
    break;
  case BASE_TYPE_VECTOR:
    Type::VectorType(&local_60,type);
    std::__cxx11::string::string((string *)&local_80,(string *)bb_var_name);
    ByteBufferGetter(__return_storage_ptr__,this,&local_60,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    break;
  case BASE_TYPE_STRUCT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"__struct",local_3d);
    std::allocator<char>::~allocator(local_3d);
    break;
  case BASE_TYPE_UNION:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"__union",&local_3e);
    std::allocator<char>::~allocator(&local_3e);
    break;
  default:
    std::operator+(&local_c0,bb_var_name,".");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"get",&local_101);
    GenTypeBasic_abi_cxx11_(&local_128,(KotlinGenerator *)bb_var_name_local,type_00);
    Namer::Method(&local_e0,&(this->namer_).super_Namer,&local_100,&local_128);
    std::operator+(__return_storage_ptr__,&local_c0,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator(&local_101);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ByteBufferGetter(const Type &type,
                               std::string bb_var_name) const {
    switch (type.base_type) {
      case BASE_TYPE_STRING: return "__string";
      case BASE_TYPE_STRUCT: return "__struct";
      case BASE_TYPE_UNION: return "__union";
      case BASE_TYPE_VECTOR:
        return ByteBufferGetter(type.VectorType(), bb_var_name);
      case BASE_TYPE_INT:
      case BASE_TYPE_UINT: return bb_var_name + ".getInt";
      case BASE_TYPE_SHORT:
      case BASE_TYPE_USHORT: return bb_var_name + ".getShort";
      case BASE_TYPE_ULONG:
      case BASE_TYPE_LONG: return bb_var_name + ".getLong";
      case BASE_TYPE_FLOAT: return bb_var_name + ".getFloat";
      case BASE_TYPE_DOUBLE: return bb_var_name + ".getDouble";
      case BASE_TYPE_CHAR:
      case BASE_TYPE_UCHAR:
      case BASE_TYPE_NONE:
      case BASE_TYPE_UTYPE: return bb_var_name + ".get";
      case BASE_TYPE_BOOL: return "0.toByte() != " + bb_var_name + ".get";
      default:
        return bb_var_name + "." +
               namer_.Method("get", GenTypeBasic(type.base_type));
    }
  }